

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void concept_suite::bidirectional_iterator_decrementable(void)

{
  iterator *this;
  bool bVar1;
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_160;
  iterator local_158;
  iterator *local_140;
  iterator *b;
  iterator a;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_108,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_d8,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_a8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,"alpha");
  local_48._0_8_ = &local_108;
  local_48._8_8_ = 4;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_160 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_160 = local_160 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_160);
  } while (local_160 != &local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)&b,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator++((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)&b);
  local_140 = trial::dynamic::basic_variable<std::allocator<char>_>::
              iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                            *)&b);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    (local_140,(iterator *)&b);
  boost::detail::test_impl
            ("b == a",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x91,"void concept_suite::bidirectional_iterator_decrementable()",bVar1);
  this = local_140;
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_158,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    (this,&local_158);
  boost::detail::test_impl
            ("b == data.begin()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x92,"void concept_suite::bidirectional_iterator_decrementable()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)&b);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void bidirectional_iterator_decrementable()
{
    variable data = array::make({ true, 2, 3.0, "alpha" });
    variable::iterator a = data.begin();
    ++a;
    variable::iterator& b = --a;
    TRIAL_PROTOCOL_TEST(b == a);
    TRIAL_PROTOCOL_TEST(b == data.begin());
}